

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O1

bool __thiscall
CKey::SignCompact(CKey *this,uint256 *hash,
                 vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig)

{
  array<unsigned_char,_32UL> *paVar1;
  int iVar2;
  long in_FS_OFFSET;
  int rec;
  secp256k1_pubkey rpk;
  secp256k1_pubkey epk;
  secp256k1_ecdsa_recoverable_signature rsig;
  int local_f0;
  secp256k1_pubkey local_e9;
  secp256k1_pubkey local_a9;
  secp256k1_ecdsa_recoverable_signature local_69;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = (this->keydata)._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  if (paVar1 != (array<unsigned_char,_32UL> *)0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(vchSig,0x41);
    local_f0 = -1;
    iVar2 = secp256k1_ecdsa_sign_recoverable
                      (secp256k1_context_sign,&local_69,(uchar *)hash,
                       ((this->keydata)._M_t.
                        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                       _M_head_impl)->_M_elems,nonce_function_rfc6979,(void *)0x0);
    if (iVar2 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                    ,0x100,
                    "bool CKey::SignCompact(const uint256 &, std::vector<unsigned char> &) const");
    }
    iVar2 = secp256k1_ecdsa_recoverable_signature_serialize_compact
                      (secp256k1_context_sign,
                       (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1,&local_f0,&local_69);
    if (iVar2 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                    ,0x102,
                    "bool CKey::SignCompact(const uint256 &, std::vector<unsigned char> &) const");
    }
    if (local_f0 == -1) {
      __assert_fail("rec != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                    ,0x103,
                    "bool CKey::SignCompact(const uint256 &, std::vector<unsigned char> &) const");
    }
    *(vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
     super__Vector_impl_data._M_start = (char)local_f0 + this->fCompressed * '\x04' + '\x1b';
    iVar2 = secp256k1_ec_pubkey_create
                      (secp256k1_context_sign,&local_a9,
                       ((this->keydata)._M_t.
                        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                       _M_head_impl)->_M_elems);
    if (iVar2 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                    ,0x108,
                    "bool CKey::SignCompact(const uint256 &, std::vector<unsigned char> &) const");
    }
    iVar2 = secp256k1_ecdsa_recover(secp256k1_context_static,&local_e9,&local_69,(uchar *)hash);
    if (iVar2 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                    ,0x10a,
                    "bool CKey::SignCompact(const uint256 &, std::vector<unsigned char> &) const");
    }
    iVar2 = secp256k1_ec_pubkey_cmp(secp256k1_context_static,&local_a9,&local_e9);
    if (iVar2 != 0) {
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                    ,0x10c,
                    "bool CKey::SignCompact(const uint256 &, std::vector<unsigned char> &) const");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return paVar1 != (array<unsigned_char,_32UL> *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool CKey::SignCompact(const uint256 &hash, std::vector<unsigned char>& vchSig) const {
    if (!keydata)
        return false;
    vchSig.resize(CPubKey::COMPACT_SIGNATURE_SIZE);
    int rec = -1;
    secp256k1_ecdsa_recoverable_signature rsig;
    int ret = secp256k1_ecdsa_sign_recoverable(secp256k1_context_sign, &rsig, hash.begin(), UCharCast(begin()), secp256k1_nonce_function_rfc6979, nullptr);
    assert(ret);
    ret = secp256k1_ecdsa_recoverable_signature_serialize_compact(secp256k1_context_sign, &vchSig[1], &rec, &rsig);
    assert(ret);
    assert(rec != -1);
    vchSig[0] = 27 + rec + (fCompressed ? 4 : 0);
    // Additional verification step to prevent using a potentially corrupted signature
    secp256k1_pubkey epk, rpk;
    ret = secp256k1_ec_pubkey_create(secp256k1_context_sign, &epk, UCharCast(begin()));
    assert(ret);
    ret = secp256k1_ecdsa_recover(secp256k1_context_static, &rpk, &rsig, hash.begin());
    assert(ret);
    ret = secp256k1_ec_pubkey_cmp(secp256k1_context_static, &epk, &rpk);
    assert(ret == 0);
    return true;
}